

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void steal_player_item(melee_effect_handler_context_t *context)

{
  object *obj_00;
  _Bool _Var1;
  uint32_t uVar2;
  char *pcVar3;
  char local_d8 [8];
  char m_name [80];
  _Bool local_7a;
  byte local_79;
  wchar_t index;
  _Bool none_left;
  _Bool split;
  char o_name [80];
  object *stolen;
  object *obj;
  wchar_t tries;
  melee_effect_handler_context_t *context_local;
  
  obj._4_4_ = 0;
  while( true ) {
    if (9 < obj._4_4_) {
      return;
    }
    local_79 = 0;
    local_7a = false;
    uVar2 = Rand_div((uint)z_info->pack_size);
    obj_00 = context->p->upkeep->inven[(int)uVar2];
    if ((obj_00 != (object *)0x0) && (obj_00->artifact == (artifact *)0x0)) break;
    obj._4_4_ = obj._4_4_ + 1;
  }
  object_desc((char *)&index,0x50,obj_00,3,context->p);
  if (1 < obj_00->number) {
    local_79 = 1;
  }
  _Var1 = react_to_slay(obj_00,context->mon);
  if (_Var1) {
    monster_desc(local_d8,0x50,context->mon,L'̔');
    pcVar3 = "your";
    if ((local_79 & 1) != 0) {
      pcVar3 = "one of your";
    }
    msg("%s tries to steal %s %s, but fails.",local_d8,pcVar3,&index);
  }
  else {
    pcVar3 = "Your";
    if ((local_79 & 1) != 0) {
      pcVar3 = "One of your";
    }
    gear_to_label(context->p,obj_00);
    msg("%s %s (%c) was stolen!",pcVar3,&index);
    o_name._72_8_ = gear_object_for_use(context->p,obj_00,L'\x01',false,&local_7a);
    monster_carry((chunk *)cave,context->mon,(object *)o_name._72_8_);
  }
  context->obvious = true;
  context->blinked = true;
  return;
}

Assistant:

static void steal_player_item(melee_effect_handler_context_t *context)
{
	int tries;

    /* Find an item */
    for (tries = 0; tries < 10; tries++) {
		struct object *obj, *stolen;
		char o_name[80];
		bool split = false;
		bool none_left = false;

        /* Pick an item */
		int index = randint0(z_info->pack_size);

        /* Obtain the item */
        obj = context->p->upkeep->inven[index];

		/* Skip non-objects */
		if (obj == NULL) continue;

        /* Skip artifacts */
        if (obj->artifact) continue;

        /* Get a description */
        object_desc(o_name, sizeof(o_name), obj, ODESC_FULL, context->p);

		/* Is it one of a stack being stolen? */
		if (obj->number > 1)
			split = true;

		/* Try to steal */
		if (react_to_slay(obj, context->mon)) {
			/* React to objects that hurt the monster */
			char m_name[80];

			/* Get the monster names (or "it") */
			monster_desc(m_name, sizeof(m_name), context->mon, MDESC_STANDARD);

			/* Fail to steal */
			msg("%s tries to steal %s %s, but fails.", m_name,
				(split ? "one of your" : "your"), o_name);
		} else {
			/* Message */
			msg("%s %s (%c) was stolen!",
				(split ? "One of your" : "Your"), o_name,
				gear_to_label(context->p, obj));

			/* Steal and carry */
			stolen = gear_object_for_use(context->p, obj, 1,
				false, &none_left);
			(void)monster_carry(cave, context->mon, stolen);
		}

        /* Obvious */
        context->obvious = true;

        /* Blink away */
        context->blinked = true;

        /* Done */
        break;
    }
}